

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

string * __thiscall
kws::Parser::GetErrorTag_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,unsigned_long number)

{
  char *__s;
  size_t sVar1;
  
  __s = ErrorTag + number * 4;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::GetErrorTag(unsigned long number) const
{
  return ErrorTag[number];
}